

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterJoinAll(VdbeSorter *pSorter,int rcin)

{
  int iVar1;
  int rc2;
  SortSubtask *pTask;
  int local_18;
  int i;
  int rc;
  int rcin_local;
  VdbeSorter *pSorter_local;
  
  pTask._4_4_ = (uint)pSorter->nTask;
  local_18 = rcin;
  while (pTask._4_4_ = pTask._4_4_ - 1, -1 < (int)pTask._4_4_) {
    iVar1 = vdbeSorterJoinThread(pSorter->aTask + (int)pTask._4_4_);
    if (local_18 == 0) {
      local_18 = iVar1;
    }
  }
  return local_18;
}

Assistant:

static int vdbeSorterJoinAll(VdbeSorter *pSorter, int rcin){
  int rc = rcin;
  int i;

  /* This function is always called by the main user thread.
  **
  ** If this function is being called after SorterRewind() has been called, 
  ** it is possible that thread pSorter->aTask[pSorter->nTask-1].pThread
  ** is currently attempt to join one of the other threads. To avoid a race
  ** condition where this thread also attempts to join the same object, join 
  ** thread pSorter->aTask[pSorter->nTask-1].pThread first. */
  for(i=pSorter->nTask-1; i>=0; i--){
    SortSubtask *pTask = &pSorter->aTask[i];
    int rc2 = vdbeSorterJoinThread(pTask);
    if( rc==SQLITE_OK ) rc = rc2;
  }
  return rc;
}